

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomLayout::~DomLayout(DomLayout *this)

{
  QList<DomProperty_*> *in_RDI;
  
  qDeleteAll<QList<DomProperty*>>(in_RDI);
  QList<DomProperty_*>::clear(in_RDI);
  qDeleteAll<QList<DomProperty*>>(in_RDI);
  QList<DomProperty_*>::clear(in_RDI);
  qDeleteAll<QList<DomLayoutItem*>>((QList<DomLayoutItem_*> *)in_RDI);
  QList<DomLayoutItem_*>::clear((QList<DomLayoutItem_*> *)in_RDI);
  QList<DomLayoutItem_*>::~QList((QList<DomLayoutItem_*> *)0x1ad8a9);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x1ad8ba);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x1ad8cb);
  QString::~QString((QString *)0x1ad8dc);
  QString::~QString((QString *)0x1ad8ed);
  QString::~QString((QString *)0x1ad8fe);
  QString::~QString((QString *)0x1ad90c);
  QString::~QString((QString *)0x1ad91a);
  QString::~QString((QString *)0x1ad928);
  QString::~QString((QString *)0x1ad932);
  return;
}

Assistant:

DomLayout::~DomLayout()
{
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
    qDeleteAll(m_item);
    m_item.clear();
}